

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

void __thiscall asmjit::JitRuntime::JitRuntime(JitRuntime *this)

{
  CpuInfo *pCVar1;
  
  (this->super_HostRuntime).super_Runtime._codeInfo._archInfo =
       (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  (this->super_HostRuntime).super_Runtime._codeInfo.field_1 =
       (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  (this->super_HostRuntime).super_Runtime._codeInfo._baseAddress = 0xffffffffffffffff;
  (this->super_HostRuntime).super_Runtime._vptr_Runtime = (_func_int **)&PTR__HostRuntime_001a7bd0;
  (this->super_HostRuntime).super_Runtime._runtimeType = '\x01';
  (this->super_HostRuntime).super_Runtime._allocType = '\0';
  pCVar1 = CpuInfo::getHost();
  (this->super_HostRuntime).super_Runtime._codeInfo._archInfo.field_0 = (pCVar1->_archInfo).field_0;
  (this->super_HostRuntime).super_Runtime._codeInfo.field_1._packedMiscInfo = 0x21212110;
  (this->super_HostRuntime).super_Runtime._vptr_Runtime = (_func_int **)&PTR__JitRuntime_001a7c08;
  VMemMgr::VMemMgr(&this->_memMgr);
  return;
}

Assistant:

JitRuntime::JitRuntime() noexcept {}